

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPacking.cpp
# Opt level: O0

void __thiscall
wasm::MemoryPacking::calculateRanges
          (MemoryPacking *this,
          unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *segment,
          Referrers *referrers,
          vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
          *ranges)

{
  size_t sVar1;
  initializer_list<wasm::(anonymous_namespace)::Range> __l;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  _Var2;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  _Var3;
  ulong uVar4;
  vector<char,_std::allocator<char>_> *pvVar5;
  vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
  *this_00;
  pointer pDVar6;
  size_type sVar7;
  reference pvVar8;
  reference ppEVar9;
  pointer pRVar10;
  reference pvVar11;
  reference __x;
  Range *pRVar12;
  bool bVar13;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  local_190;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  local_188;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  local_180;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  right;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  local_170;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  curr;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  local_160;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  left;
  size_t i;
  allocator<wasm::(anonymous_namespace)::Range> local_139;
  Range local_138;
  iterator local_120;
  size_type local_118;
  undefined1 local_110 [8];
  vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
  mergedRanges;
  const_iterator local_f0;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  local_e8;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  local_e0;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  second;
  iterator first;
  const_iterator local_c8;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  local_c0;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  local_b8;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  penultimate;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  local_a8;
  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
  last;
  Expression *referrer;
  const_iterator __end2;
  const_iterator __begin2;
  Referrers *__range2;
  size_t edgeThreshold;
  size_t threshold;
  size_t local_68;
  ulong local_60;
  value_type local_58;
  ulong local_40;
  size_t end;
  size_t start;
  vector<char,_std::allocator<char>_> *data;
  vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
  *ranges_local;
  Referrers *referrers_local;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *segment_local;
  MemoryPacking *this_local;
  
  data = (vector<char,_std::allocator<char>_> *)ranges;
  ranges_local = (vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                  *)referrers;
  referrers_local = (Referrers *)segment;
  segment_local = (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)this;
  pDVar6 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (segment);
  start = (size_t)&pDVar6->data;
  sVar7 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)start);
  if (sVar7 != 0) {
    end = 0;
    while (sVar1 = end,
          sVar7 = std::vector<char,_std::allocator<char>_>::size
                            ((vector<char,_std::allocator<char>_> *)start), sVar1 < sVar7) {
      local_40 = end;
      while( true ) {
        uVar4 = local_40;
        sVar7 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)start);
        bVar13 = false;
        if (uVar4 < sVar7) {
          pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)start,local_40);
          bVar13 = *pvVar8 == '\0';
        }
        if (!bVar13) break;
        local_40 = local_40 + 1;
      }
      if (end < local_40) {
        local_58.isZero = true;
        local_58.start = end;
        local_58.end = local_40;
        std::
        vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
        ::push_back((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                     *)data,&local_58);
        end = local_40;
      }
      while( true ) {
        uVar4 = local_40;
        sVar7 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)start);
        bVar13 = false;
        if (uVar4 < sVar7) {
          pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)start,local_40);
          bVar13 = *pvVar8 != '\0';
        }
        if (!bVar13) break;
        local_40 = local_40 + 1;
      }
      if (end < local_40) {
        threshold._0_1_ = 0;
        local_68 = end;
        local_60 = local_40;
        std::
        vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
        ::push_back((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                     *)data,(value_type *)&threshold);
        end = local_40;
      }
    }
    pDVar6 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                        referrers_local);
    this_00 = ranges_local;
    if ((pDVar6->isPassive & 1U) == 0) {
      edgeThreshold = 8;
    }
    else {
      edgeThreshold = 2;
      __range2 = (Referrers *)0x0;
      __end2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                         ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          ranges_local);
      referrer = (Expression *)
                 std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                           ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                            this_00);
      while (bVar13 = __gnu_cxx::operator!=
                                (&__end2,(__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                          *)&referrer), bVar13) {
        ppEVar9 = __gnu_cxx::
                  __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                  ::operator*(&__end2);
        last._M_current = (Range *)*ppEVar9;
        bVar13 = Expression::is<wasm::MemoryInit>((Expression *)last._M_current);
        if (bVar13) {
          edgeThreshold = edgeThreshold + 0x13;
          __range2 = (Referrers *)
                     ((long)&(__range2->
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish + 1);
        }
        else {
          edgeThreshold = edgeThreshold + 3;
        }
        __gnu_cxx::
        __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
        ::operator++(&__end2);
      }
      sVar7 = std::
              vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
              ::size((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                      *)data);
      if (1 < sVar7) {
        penultimate._M_current =
             (Range *)std::
                      vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                      ::end((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                             *)data);
        local_a8 = __gnu_cxx::
                   __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                   ::operator-(&penultimate,1);
        local_c0._M_current =
             (Range *)std::
                      vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                      ::end((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                             *)data);
        local_b8 = __gnu_cxx::
                   __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                   ::operator-(&local_c0,2);
        pRVar10 = __gnu_cxx::
                  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                  ::operator->(&local_a8);
        if ((pRVar10->isZero & 1U) != 0) {
          pRVar10 = __gnu_cxx::
                    __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                    ::operator->(&local_a8);
          sVar1 = pRVar10->end;
          pRVar10 = __gnu_cxx::
                    __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                    ::operator->(&local_a8);
          if ((Referrers *)(sVar1 - pRVar10->start) <= __range2) {
            pRVar10 = __gnu_cxx::
                      __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                      ::operator->(&local_a8);
            sVar1 = pRVar10->end;
            pRVar10 = __gnu_cxx::
                      __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                      ::operator->(&local_b8);
            pvVar5 = data;
            pRVar10->end = sVar1;
            __gnu_cxx::
            __normal_iterator<wasm::(anonymous_namespace)::Range_const*,std::vector<wasm::(anonymous_namespace)::Range,std::allocator<wasm::(anonymous_namespace)::Range>>>
            ::__normal_iterator<wasm::(anonymous_namespace)::Range*>
                      ((__normal_iterator<wasm::(anonymous_namespace)::Range_const*,std::vector<wasm::(anonymous_namespace)::Range,std::allocator<wasm::(anonymous_namespace)::Range>>>
                        *)&local_c8,&local_a8);
            std::
            vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
            ::erase((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                     *)pvVar5,local_c8);
          }
        }
      }
      sVar7 = std::
              vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
              ::size((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                      *)data);
      if (1 < sVar7) {
        second._M_current =
             (Range *)std::
                      vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                      ::begin((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                               *)data);
        local_e8._M_current =
             (Range *)std::
                      vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                      ::begin((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                               *)data);
        local_e0 = __gnu_cxx::
                   __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                   ::operator+(&local_e8,1);
        pRVar10 = __gnu_cxx::
                  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                  ::operator->(&second);
        if ((pRVar10->isZero & 1U) != 0) {
          pRVar10 = __gnu_cxx::
                    __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                    ::operator->(&second);
          sVar1 = pRVar10->end;
          pRVar10 = __gnu_cxx::
                    __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                    ::operator->(&second);
          if ((Referrers *)(sVar1 - pRVar10->start) <= __range2) {
            pRVar10 = __gnu_cxx::
                      __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                      ::operator->(&second);
            sVar1 = pRVar10->start;
            pRVar10 = __gnu_cxx::
                      __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                      ::operator->(&local_e0);
            pvVar5 = data;
            pRVar10->start = sVar1;
            __gnu_cxx::
            __normal_iterator<wasm::(anonymous_namespace)::Range_const*,std::vector<wasm::(anonymous_namespace)::Range,std::allocator<wasm::(anonymous_namespace)::Range>>>
            ::__normal_iterator<wasm::(anonymous_namespace)::Range*>
                      ((__normal_iterator<wasm::(anonymous_namespace)::Range_const*,std::vector<wasm::(anonymous_namespace)::Range,std::allocator<wasm::(anonymous_namespace)::Range>>>
                        *)&local_f0,&second);
            mergedRanges.
            super__Vector_base<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)std::
                          vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                          ::erase((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                                   *)pvVar5,local_f0);
          }
        }
      }
    }
    pvVar11 = std::
              vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
              ::front((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                       *)data);
    local_138.end = pvVar11->end;
    local_138.isZero = pvVar11->isZero;
    local_138._1_7_ = *(undefined7 *)&pvVar11->field_0x1;
    local_138.start = pvVar11->start;
    local_120 = &local_138;
    local_118 = 1;
    std::allocator<wasm::(anonymous_namespace)::Range>::allocator(&local_139);
    __l._M_len = local_118;
    __l._M_array = local_120;
    std::
    vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
    ::vector((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
              *)local_110,__l,&local_139);
    std::allocator<wasm::(anonymous_namespace)::Range>::~allocator(&local_139);
    for (left._M_current = (Range *)0x1; _Var2._M_current = left._M_current,
        sVar7 = std::
                vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                ::size((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                        *)data), _Var3 = left, _Var2._M_current < (Range *)(sVar7 - 1);
        left._M_current = (Range *)&(left._M_current)->field_0x1) {
      curr._M_current =
           (Range *)std::
                    vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                    ::end((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                           *)local_110);
      local_160 = __gnu_cxx::
                  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                  ::operator-(&curr,1);
      right._M_current =
           (Range *)std::
                    vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                    ::begin((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                             *)data);
      local_170 = __gnu_cxx::
                  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                  ::operator+(&right,left._M_current);
      local_190._M_current =
           (Range *)std::
                    vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                    ::begin((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                             *)data);
      local_188 = __gnu_cxx::
                  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                  ::operator+(&local_190,left._M_current);
      local_180 = __gnu_cxx::
                  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                  ::operator+(&local_188,1);
      pRVar10 = __gnu_cxx::
                __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                ::operator->(&local_170);
      if ((pRVar10->isZero & 1U) == 0) {
LAB_0180ccfe:
        __x = __gnu_cxx::
              __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
              ::operator*(&local_170);
        std::
        vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
        ::push_back((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                     *)local_110,__x);
      }
      else {
        pRVar10 = __gnu_cxx::
                  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                  ::operator->(&local_170);
        sVar1 = pRVar10->end;
        pRVar10 = __gnu_cxx::
                  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                  ::operator->(&local_170);
        if (edgeThreshold < sVar1 - pRVar10->start) goto LAB_0180ccfe;
        pRVar10 = __gnu_cxx::
                  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                  ::operator->(&local_180);
        sVar1 = pRVar10->end;
        pRVar10 = __gnu_cxx::
                  __normal_iterator<wasm::(anonymous_namespace)::Range_*,_std::vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>_>
                  ::operator->(&local_160);
        pRVar10->end = sVar1;
        left._M_current = (Range *)&(left._M_current)->field_0x1;
      }
    }
    pRVar12 = (Range *)std::
                       vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                       ::size((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                               *)data);
    if (_Var3._M_current < pRVar12) {
      pvVar11 = std::
                vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                ::back((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                        *)data);
      std::
      vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
      ::push_back((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                   *)local_110,pvVar11);
    }
    std::swap<wasm::(anonymous_namespace)::Range,std::allocator<wasm::(anonymous_namespace)::Range>>
              ((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                *)data,(vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
                        *)local_110);
    std::
    vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
    ::~vector((vector<wasm::(anonymous_namespace)::Range,_std::allocator<wasm::(anonymous_namespace)::Range>_>
               *)local_110);
  }
  return;
}

Assistant:

void MemoryPacking::calculateRanges(const std::unique_ptr<DataSegment>& segment,
                                    const Referrers& referrers,
                                    std::vector<Range>& ranges) {
  auto& data = segment->data;
  if (data.size() == 0) {
    return;
  }

  // Calculate initial zero and nonzero ranges
  size_t start = 0;
  while (start < data.size()) {
    size_t end = start;
    while (end < data.size() && data[end] == 0) {
      end++;
    }
    if (end > start) {
      ranges.push_back({true, start, end});
      start = end;
    }
    while (end < data.size() && data[end] != 0) {
      end++;
    }
    if (end > start) {
      ranges.push_back({false, start, end});
      start = end;
    }
  }

  // Calculate the number of consecutive zeroes for which splitting is
  // beneficial. This is an approximation that assumes all memory.inits cover an
  // entire segment and that all its arguments are constants. These assumptions
  // are true of all memory.inits generated by the tools.
  size_t threshold = 0;
  if (segment->isPassive) {
    // Passive segment metadata size
    threshold += 2;
    // Zeroes on the edge do not increase the number of segments or data.drops,
    // so their threshold is lower. The threshold for interior zeroes depends on
    // an estimate of the number of new memory.fill and data.drop instructions
    // splitting would introduce.
    size_t edgeThreshold = 0;
    for (auto* referrer : referrers) {
      if (referrer->is<MemoryInit>()) {
        // Splitting adds a new memory.fill and a new memory.init
        threshold += MEMORY_FILL_SIZE + MEMORY_INIT_SIZE;
        edgeThreshold += MEMORY_FILL_SIZE;
      } else {
        threshold += DATA_DROP_SIZE;
      }
    }

    // Merge edge zeroes if they are not worth splitting
    if (ranges.size() >= 2) {
      auto last = ranges.end() - 1;
      auto penultimate = ranges.end() - 2;
      if (last->isZero && last->end - last->start <= edgeThreshold) {
        penultimate->end = last->end;
        ranges.erase(last);
      }
    }
    if (ranges.size() >= 2) {
      auto first = ranges.begin();
      auto second = ranges.begin() + 1;
      if (first->isZero && first->end - first->start <= edgeThreshold) {
        second->start = first->start;
        ranges.erase(first);
      }
    }
  } else {
    // Legacy ballpark overhead of active segment with offset
    // TODO: Tune this
    threshold = 8;
  }

  // Merge ranges across small spans of zeroes
  std::vector<Range> mergedRanges = {ranges.front()};
  size_t i;
  for (i = 1; i < ranges.size() - 1; ++i) {
    auto left = mergedRanges.end() - 1;
    auto curr = ranges.begin() + i;
    auto right = ranges.begin() + i + 1;
    if (curr->isZero && curr->end - curr->start <= threshold) {
      left->end = right->end;
      ++i;
    } else {
      mergedRanges.push_back(*curr);
    }
  }
  // Add the final range if it hasn't already been merged in
  if (i < ranges.size()) {
    mergedRanges.push_back(ranges.back());
  }
  std::swap(ranges, mergedRanges);
}